

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Application.cpp
# Opt level: O1

void Application::glfw_key_callback(GLFWwindow *window,int key,int scancode,int action,int mods)

{
  void *pvVar1;
  ImGuiContext *pIVar2;
  
  pvVar1 = glfwGetWindowUserPointer(window);
  pIVar2 = ImGui::GetCurrentContext();
  if ((pIVar2->NavWindow != (ImGuiWindow *)0x0) &&
     (pIVar2 = ImGui::GetCurrentContext(), (pIVar2->NavWindow->Flags & 0x2000) == 0)) {
    return;
  }
  if (key == 0x58 && action == 1) {
    *(byte *)((long)pvVar1 + 0x174) = *(byte *)((long)pvVar1 + 0x174) ^ 1;
  }
  return;
}

Assistant:

void Application::glfw_key_callback(GLFWwindow *window, int key, int scancode, int action, int mods) {
	auto *app = (Application *)glfwGetWindowUserPointer(window);
	if (!ImGui::GetCurrentContext()->NavWindow ||
	    (ImGui::GetCurrentContext()->NavWindow->Flags & ImGuiWindowFlags_NoBringToFrontOnFocus)) {
		if (action == GLFW_PRESS && key == GLFW_KEY_X)
			app->m_ui_display_flag ^= 1u;
	}
}